

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

int ma_dr_mp3dec_decode_frame
              (ma_dr_mp3dec *dec,ma_uint8 *mp3,int mp3_bytes,void *pcm,ma_dr_mp3dec_frame_info *info
              )

{
  char *pcVar1;
  int *piVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  byte bVar7;
  ushort uVar8;
  short sVar9;
  short sVar10;
  undefined2 uVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint uVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined8 uVar44;
  byte bVar45;
  byte bVar46;
  uint uVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  ma_uint32 mVar51;
  uint uVar52;
  ma_uint32 mVar53;
  ma_uint32 mVar54;
  long lVar55;
  long lVar56;
  ma_dr_mp3_bs *pmVar57;
  undefined1 *puVar58;
  float *pfVar59;
  byte bVar60;
  byte bVar61;
  undefined1 uVar62;
  int iVar63;
  undefined1 (*pauVar64) [16];
  uint uVar65;
  long lVar66;
  undefined1 (*pauVar67) [16];
  uint uVar68;
  uint uVar69;
  ulong uVar70;
  int iVar71;
  uint uVar72;
  long lVar73;
  ma_uint8 *pmVar74;
  undefined1 (*pauVar75) [16];
  uint uVar76;
  float *pfVar77;
  long *plVar78;
  void *pvVar79;
  float *pfVar80;
  uint uVar81;
  undefined4 *__dest;
  void *__dest_00;
  float *pfVar82;
  undefined1 *puVar83;
  float (*overlap) [288];
  ulong uVar84;
  uint *puVar85;
  uint uVar86;
  uint uVar87;
  ma_dr_mp3d_sample_t *pmVar88;
  ma_dr_mp3_bs *pmVar89;
  uint uVar90;
  ma_uint8 *pmVar91;
  ma_uint8 *pmVar92;
  byte *pbVar93;
  ma_uint8 *pmVar94;
  ulong uVar95;
  ulong uVar96;
  ma_uint8 *h;
  ma_dr_mp3dec_frame_info *pmVar97;
  byte bVar98;
  bool bVar99;
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar103;
  undefined1 in_XMM1 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar104;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  int iVar153;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  ma_uint8 scf_size [4];
  ma_dr_mp3_bs bs_frame [1];
  ma_dr_mp3_L12_scale_info sci [1];
  ma_dr_mp3dec_scratch scratch;
  ulong local_43d8;
  undefined1 *local_43c0;
  ulong local_43a0;
  ma_uint8 *local_4398;
  byte local_438c [4];
  ma_dr_mp3_bs local_4388;
  long *local_4378;
  ma_dr_mp3d_sample_t *local_4370;
  ma_uint8 *local_4368;
  ma_dr_mp3dec_frame_info *local_4360;
  ma_uint8 *local_4358;
  long local_4350;
  float *local_4348;
  ulong local_4340;
  undefined4 local_4338;
  float fStack_4334;
  undefined4 local_4330;
  byte local_4038;
  byte local_4037;
  byte local_4036 [64];
  byte abStack_3ff6 [70];
  ma_dr_mp3_bs local_3fb0;
  ma_uint8 local_3fa0 [2816];
  undefined8 local_34a0;
  undefined1 local_3498 [8];
  byte bStack_3490;
  undefined2 local_348f;
  byte local_348d [3];
  undefined2 local_348a;
  byte local_3488 [104];
  float local_3420 [4];
  float afStack_3410 [10];
  undefined1 local_33e8 [20];
  undefined1 local_33d4 [2228];
  undefined1 local_2b20 [16];
  float afStack_2b10 [572];
  float local_2220 [40];
  float local_2180 [2112];
  undefined1 local_80 [39];
  byte local_59 [41];
  
  bVar46 = 0;
  uVar70 = 0;
  local_4370 = (ma_dr_mp3d_sample_t *)pcm;
  local_4360 = info;
  if ((4 < mp3_bytes) && (uVar70 = 0, dec->header[0] == 0xff)) {
    iVar48 = ma_dr_mp3_hdr_compare(dec->header,mp3);
    uVar70 = 0;
    if (iVar48 != 0) {
      iVar48 = ma_dr_mp3_hdr_frame_bytes(mp3,dec->free_format_bytes);
      iVar63 = 0;
      if ((mp3[2] & 2) != 0) {
        iVar63 = (uint)((~mp3[1] & 6) == 0) * 3 + 1;
      }
      uVar47 = iVar63 + iVar48;
      uVar70 = (ulong)uVar47;
      if ((uVar47 != mp3_bytes) &&
         ((mp3_bytes < (int)(uVar47 + 4) ||
          (iVar48 = ma_dr_mp3_hdr_compare(mp3,mp3 + (int)uVar47), iVar48 == 0)))) {
        uVar70 = 0;
      }
    }
  }
  local_4398._0_4_ = 0;
  local_43a0._0_4_ = (int)uVar70;
  local_4368 = mp3;
  if ((int)local_43a0 == 0) {
    local_43a0._0_4_ = 0;
    memset(dec,0,0x1a0c);
    local_4398._0_4_ = mp3_bytes;
    if (4 < mp3_bytes) {
      uVar47 = mp3_bytes - 4;
      local_4398 = (ma_uint8 *)(ulong)uVar47;
      pmVar92 = local_4368 + 4;
      pmVar74 = (ma_uint8 *)0x0;
      h = local_4368;
      local_43a0 = uVar70;
      local_4378 = (long *)(ulong)(uint)mp3_bytes;
      local_4358 = local_4398;
      do {
        iVar48 = ma_dr_mp3_hdr_valid(h);
        if (iVar48 != 0) {
          iVar48 = ma_dr_mp3_hdr_frame_bytes(h,dec->free_format_bytes);
          iVar63 = 0;
          if ((h[2] & 2) != 0) {
            iVar63 = (uint)((~h[1] & 6) == 0) * 3 + 1;
          }
          local_43d8 = (ulong)(uint)(iVar63 + iVar48);
          bVar99 = iVar48 == 0;
          if ((bVar99) && (bVar99 = true, (int)pmVar74 + 8 < (int)uVar47)) {
            iVar63 = 4;
            lVar73 = 0;
            pmVar91 = pmVar74;
            pmVar94 = pmVar92;
            do {
              iVar48 = ma_dr_mp3_hdr_compare(h,h + lVar73 + 4);
              iVar71 = (int)pmVar91;
              if (iVar48 == 0) {
LAB_00158f3f:
                iVar48 = 0;
              }
              else {
                iVar48 = 0;
                uVar87 = 0;
                if ((h[2] & 2) != 0) {
                  uVar87 = -(uint)((~h[1] & 6) != 0) | 0xfffffffc;
                }
                if ((h[lVar73 + 6] & 2) != 0) {
                  iVar48 = (uint)((~h[lVar73 + 5] & 6) == 0) * 3 + 1;
                }
                if (mp3_bytes < (int)(iVar48 + uVar87 + iVar71 + 0xc)) goto LAB_00158f3f;
                iVar49 = ma_dr_mp3_hdr_compare(h,pmVar94 + (iVar48 + uVar87 + iVar63));
                iVar48 = 0;
                if (iVar49 != 0) {
                  iVar48 = uVar87 + (int)lVar73 + 4;
                  dec->free_format_bytes = iVar48;
                  local_43d8 = lVar73 + 4U & 0xffffffff;
                }
              }
              bVar99 = iVar48 == 0;
              if ((0x8fe < lVar73 + 4U) || (iVar48 != 0)) break;
              pmVar94 = pmVar94 + 1;
              iVar63 = iVar63 + 1;
              lVar73 = lVar73 + 1;
              pmVar91 = pmVar91 + 2;
            } while (iVar71 + 10 < (int)uVar47);
          }
          if ((bVar99) || (mp3_bytes < (int)pmVar74 + (int)local_43d8)) {
LAB_00159049:
            if ((pmVar74 == (ma_uint8 *)0x0) && ((int)local_43d8 == mp3_bytes)) {
              bVar99 = false;
              local_43a0 = local_43d8;
              local_4398 = (ma_uint8 *)0x0;
            }
            else {
              dec->free_format_bytes = 0;
              bVar99 = true;
            }
          }
          else {
            lVar73 = (long)local_4378 - (long)pmVar74;
            iVar71 = 0;
            iVar63 = 0;
            do {
              iVar49 = ma_dr_mp3_hdr_frame_bytes(h + iVar63,iVar48);
              iVar50 = 0;
              if ((h[(long)iVar63 + 2] & 2) != 0) {
                iVar50 = (uint)((~(h + iVar63)[1] & 6) == 0) * 3 + 1;
              }
              if (lVar73 < iVar50 + iVar49 + iVar63 + 4) {
                if (iVar71 == 0) goto LAB_00159049;
                break;
              }
              iVar63 = iVar49 + iVar63 + iVar50;
              iVar49 = ma_dr_mp3_hdr_compare(h,h + iVar63);
              if (iVar49 == 0) goto LAB_00159049;
              iVar71 = iVar71 + -1;
            } while (iVar71 != -10);
            bVar99 = false;
            local_43a0 = local_43d8;
            local_4398 = (ma_uint8 *)((ulong)pmVar74 & 0xffffffff);
          }
          if (!bVar99) goto LAB_001590b0;
        }
        pmVar74 = pmVar74 + 1;
        h = h + 1;
        pmVar92 = pmVar92 + 1;
      } while (pmVar74 != local_4358);
      local_43a0._0_4_ = 0;
      local_4398._0_4_ = mp3_bytes;
    }
LAB_001590b0:
    if (((int)local_43a0 == 0) || (mp3_bytes < (int)local_4398 + (int)local_43a0)) {
      local_4360->frame_bytes = (int)local_4398;
      return 0;
    }
  }
  pmVar92 = local_4368 + (int)local_4398;
  local_4388.buf = pmVar92 + 4;
  *(undefined4 *)dec->header = *(undefined4 *)pmVar92;
  local_4360->frame_bytes = (int)local_4398 + (int)local_43a0;
  local_4360->channels = (pmVar92[3] < 0xc0) + 1;
  local_4360->hz =
       (*(uint *)(ma_dr_mp3_hdr_sample_rate_hz(unsigned_char_const*)::g_hz + (pmVar92[2] & 0xc)) >>
       ((pmVar92[1] & 8) == 0)) >> ((pmVar92[1] & 0x10) == 0);
  uVar47 = pmVar92[1] >> 1 & 3;
  local_4360->layer = 4 - uVar47;
  local_4360->bitrate_kbps =
       (uint)(byte)ma_dr_mp3_hdr_bitrate_kbps(unsigned_char_const*)::halfrate
                   [(ulong)(pmVar92[2] >> 4) +
                    (long)(int)((pmVar92[1] >> 1 & 3) - 1) * 0xf +
                    (ulong)(pmVar92[1] >> 3 & 1) * 0x2d] * 2;
  local_4388.pos = 0;
  local_4388.limit = (int)local_43a0 * 8 + -0x20;
  bVar61 = pmVar92[1];
  if ((bVar61 & 1) == 0) {
    ma_dr_mp3_bs_get_bits(&local_4388,0x10);
  }
  pmVar92 = local_4368 + (int)local_4398;
  if ((char)uVar47 == '\x01') {
    mVar53 = 0;
    uVar47 = (pmVar92[3] < 0xc0) + 1;
    iVar48 = ((bVar61 >> 3 & 1) + (uint)((bVar61 >> 4 & 1) != 0)) * 3 + (pmVar92[2] >> 2 & 3);
    if ((bVar61 & 8) == 0) {
      mVar51 = ma_dr_mp3_bs_get_bits(&local_4388,uVar47 | 8);
      uVar52 = mVar51 >> (sbyte)uVar47;
      uVar87 = uVar47;
    }
    else {
      uVar87 = uVar47 * 2;
      uVar52 = ma_dr_mp3_bs_get_bits(&local_4388,9);
      mVar53 = ma_dr_mp3_bs_get_bits(&local_4388,uVar47 * 2 + 7);
    }
    lVar55 = (long)(int)(iVar48 + -1 + (uint)(iVar48 == 0));
    lVar73 = lVar55 * 0x28;
    bVar61 = pmVar92[3];
    iVar48 = 0;
    pbVar93 = local_3488 + 7;
    local_4368 = pmVar92;
    do {
      uVar47 = mVar53 << 4;
      if (bVar61 < 0xc0) {
        uVar47 = mVar53;
      }
      uVar70 = (ulong)uVar47;
      mVar53 = ma_dr_mp3_bs_get_bits(&local_4388,0xc);
      *(short *)(pbVar93 + -0x17) = (short)mVar53;
      mVar51 = ma_dr_mp3_bs_get_bits(&local_4388,9);
      *(short *)(pbVar93 + -0x15) = (short)mVar51;
      uVar72 = 0xffffffff;
      if (0x120 < (mVar51 & 0xffff)) goto LAB_00159565;
      mVar51 = ma_dr_mp3_bs_get_bits(&local_4388,8);
      pbVar93[-0x11] = (byte)mVar51;
      bVar98 = local_4368[1];
      mVar51 = ma_dr_mp3_bs_get_bits(&local_4388,(uint)((bVar98 & 8) == 0) * 5 + 4);
      *(short *)(pbVar93 + -0x13) = (short)mVar51;
      *(undefined1 **)(pbVar93 + -0x1f) =
           ma_dr_mp3_L3_read_side_info(ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info*,unsigned_char_const*)::
           g_scf_long + lVar55 * 0x17;
      pbVar93[-0xe] = 0x16;
      pbVar93[-0xd] = 0;
      mVar51 = ma_dr_mp3_bs_get_bits(&local_4388,1);
      if (mVar51 == 0) {
        pbVar93[-0x10] = 0;
        pbVar93[-0xf] = 0;
        mVar51 = ma_dr_mp3_bs_get_bits(&local_4388,0xf);
        mVar54 = ma_dr_mp3_bs_get_bits(&local_4388,4);
        pbVar93[-9] = (byte)mVar54;
        mVar54 = ma_dr_mp3_bs_get_bits(&local_4388,3);
        pbVar93[-8] = (byte)mVar54;
        pbVar93[-7] = 0xff;
      }
      else {
        mVar51 = ma_dr_mp3_bs_get_bits(&local_4388,2);
        pbVar93[-0x10] = (byte)mVar51;
        if ((byte)mVar51 == 0) goto LAB_00159565;
        mVar51 = ma_dr_mp3_bs_get_bits(&local_4388,1);
        pbVar93[-0xf] = (byte)mVar51;
        pbVar93[-9] = 7;
        pbVar93[-8] = 0xff;
        if (pbVar93[-0x10] == 2) {
          if ((byte)mVar51 == 0) {
            pbVar93[-9] = 8;
            *(undefined1 **)(pbVar93 + -0x1f) =
                 ma_dr_mp3_L3_read_side_info(ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info*,unsigned_char_const*)
                 ::g_scf_short + lVar73;
            bVar60 = 0x27;
            bVar45 = 0;
          }
          else {
            *(undefined1 **)(pbVar93 + -0x1f) =
                 ma_dr_mp3_L3_read_side_info(ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info*,unsigned_char_const*)
                 ::g_scf_mixed + lVar73;
            bVar45 = ((bVar98 & 8) >> 2) + 6;
            bVar60 = 0x1e;
          }
          uVar70 = (ulong)(uVar47 & 0xf0f);
          pbVar93[-0xe] = bVar45;
          pbVar93[-0xd] = bVar60;
        }
        mVar51 = ma_dr_mp3_bs_get_bits(&local_4388,10);
        mVar51 = mVar51 << 5;
        mVar54 = ma_dr_mp3_bs_get_bits(&local_4388,3);
        pbVar93[-6] = (byte)mVar54;
        mVar54 = ma_dr_mp3_bs_get_bits(&local_4388,3);
        pbVar93[-5] = (byte)mVar54;
        mVar54 = ma_dr_mp3_bs_get_bits(&local_4388,3);
        pbVar93[-4] = (byte)mVar54;
      }
      pbVar93[-0xc] = (byte)(mVar51 >> 10);
      pbVar93[-0xb] = (byte)(mVar51 >> 5) & 0x1f;
      pbVar93[-10] = (byte)mVar51 & 0x1f;
      if ((bVar98 & 8) == 0) {
        bVar98 = 499 < *(ushort *)(pbVar93 + -0x13);
      }
      else {
        mVar51 = ma_dr_mp3_bs_get_bits(&local_4388,1);
        bVar98 = (byte)mVar51;
      }
      iVar48 = iVar48 + (mVar53 & 0xffff);
      pbVar93[-3] = bVar98;
      mVar53 = ma_dr_mp3_bs_get_bits(&local_4388,1);
      pbVar93[-2] = (byte)mVar53;
      mVar53 = ma_dr_mp3_bs_get_bits(&local_4388,1);
      pbVar93[-1] = (byte)mVar53;
      *pbVar93 = (byte)(uVar70 >> 0xc) & 0xf;
      mVar53 = (int)uVar70 << 4;
      pbVar93 = pbVar93 + 0x20;
      uVar87 = uVar87 - 1;
    } while (uVar87 != 0);
    uVar72 = 0xffffffff;
    if (iVar48 + local_4388.pos <= (int)(uVar52 * 8 + local_4388.limit)) {
      uVar72 = uVar52;
    }
LAB_00159565:
    iVar48 = local_4388.pos;
    if (((int)uVar72 < 0) ||
       (iVar63 = local_4388.limit - local_4388.pos, local_4388.limit < local_4388.pos)) {
      dec->header[0] = '\0';
      uVar47 = 1;
      bVar99 = false;
    }
    else {
      uVar47 = dec->reserv;
      uVar87 = uVar72;
      if ((int)uVar47 < (int)uVar72) {
        uVar87 = uVar47;
      }
      uVar52 = 0;
      if (0 < (int)(uVar47 - uVar72)) {
        uVar52 = uVar47 - uVar72;
      }
      iVar71 = iVar63 + 7;
      if (-1 < iVar63) {
        iVar71 = iVar63;
      }
      memcpy(local_3fa0,dec->reserv_buf + uVar52,(long)(int)uVar87);
      uVar52 = iVar48 + 7;
      if (-1 < iVar48) {
        uVar52 = iVar48;
      }
      memcpy(local_3fa0 + (int)uVar87,local_4388.buf + ((int)uVar52 >> 3),(long)(iVar71 >> 3));
      local_3fb0.pos = 0;
      local_3fb0.limit = ((iVar71 >> 3) + uVar87) * 8;
      local_3fb0.buf = local_3fa0;
      if ((local_4370 != (ma_dr_mp3d_sample_t *)0x0) && ((int)uVar72 <= (int)uVar47)) {
        local_4348 = dec->qmf_state;
        uVar70 = 0;
        pmVar88 = local_4370;
        pmVar97 = local_4360;
        do {
          local_4370 = pmVar88;
          memset(local_3420,0,0x1200);
          iVar48 = pmVar97->channels;
          local_4340 = uVar70;
          local_4378 = (long *)(local_3498 + ((long)(iVar48 * (int)uVar70) * 0x10 + -4) * 2);
          local_4350 = (long)iVar48;
          auVar132._0_12_ = ZEXT812(0x3f800000);
          auVar132._12_4_ = 0;
          if (0 < (long)iVar48) {
            lVar73 = 0;
            do {
              lVar55 = (long)local_3fb0.pos;
              lVar56 = lVar73 * 0x20;
              plVar78 = local_4378 + lVar73 * 4;
              uVar8 = *(ushort *)(local_4378 + lVar73 * 4 + 1);
              local_43c0 = ma_dr_mp3_L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float*,int)
                           ::g_scf_partitions +
                           (((ulong)(*(char *)((long)local_4378 + lVar56 + 0x11) == '\0') + 1) -
                           (ulong)(*(char *)((long)local_4378 + lVar56 + 0x12) == '\0')) * 0x1c;
              cVar3 = *(char *)((long)local_4378 + lVar56 + 0x1d);
              if ((dec->header[1] & 8) == 0) {
                bVar61 = (dec->header[3] & 0x10) >> 4 & lVar73 != 0;
                uVar87 = (uint)(*(ushort *)((long)plVar78 + 0xc) >> bVar61);
                uVar70 = 0;
                if (bVar61 != 0) {
                  uVar70 = 0xc;
                }
                puVar83 = ma_dr_mp3_L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float*,int)
                          ::g_mod + uVar70;
                do {
                  uVar84 = 1;
                  lVar56 = 3;
                  do {
                    bVar61 = puVar83[lVar56];
                    local_438c[lVar56] = (byte)((uVar87 / uVar84) % (ulong)bVar61);
                    uVar52 = (int)uVar84 * (uint)bVar61;
                    uVar84 = (ulong)uVar52;
                    bVar99 = lVar56 != 0;
                    lVar56 = lVar56 + -1;
                  } while (bVar99);
                  uVar70 = uVar70 + 4;
                  puVar83 = puVar83 + 4;
                  uVar87 = uVar87 - uVar52;
                } while (-1 < (int)uVar87);
                local_43c0 = local_43c0 + (uVar70 & 0xffffffff);
                uVar87 = 0xfffffff0;
              }
              else {
                uVar87 = (uint)*(byte *)((long)plVar78 + 0x1f);
                local_438c[0] =
                     (byte)ma_dr_mp3_L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float*,int)
                           ::g_scfc_decode[*(ushort *)((long)plVar78 + 0xc)] >> 2;
                local_438c[1] = local_438c[0];
                local_438c[2] =
                     ma_dr_mp3_L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float*,int)
                     ::g_scfc_decode[*(ushort *)((long)plVar78 + 0xc)] & 3;
                local_438c[3] = local_438c[2];
              }
              __dest = &local_4338;
              puVar83 = local_80 + lVar73 * 0x27;
              lVar56 = 0;
              do {
                uVar70 = (ulong)(byte)local_43c0[lVar56];
                if (uVar70 == 0) break;
                if ((uVar87 & 8) == 0) {
                  bVar61 = local_438c[lVar56];
                  if (bVar61 == 0) {
                    memset(__dest,0,uVar70);
                    memset(puVar83,0,uVar70);
                  }
                  else {
                    mVar53 = ~(-1 << (bVar61 & 0x1f));
                    if (-1 < (int)uVar87) {
                      mVar53 = 0xffffffff;
                    }
                    uVar84 = 0;
                    do {
                      mVar51 = ma_dr_mp3_bs_get_bits(&local_3fb0,(uint)bVar61);
                      uVar62 = (char)mVar51;
                      if (mVar51 == mVar53) {
                        uVar62 = 0xff;
                      }
                      *(char *)((long)__dest + uVar84) = (char)mVar51;
                      puVar83[uVar84] = uVar62;
                      uVar84 = uVar84 + 1;
                    } while (uVar70 != uVar84);
                  }
                }
                else {
                  memcpy(__dest,puVar83,uVar70);
                }
                puVar83 = puVar83 + uVar70;
                __dest = (undefined4 *)((long)__dest + uVar70);
                lVar56 = lVar56 + 1;
                uVar87 = uVar87 * 2;
                auVar132._0_12_ = ZEXT812(0x3f800000);
                auVar132._12_4_ = 0;
              } while (lVar56 != 4);
              *(undefined1 *)((long)__dest + 2) = 0;
              *(undefined2 *)__dest = 0;
              bVar61 = *(byte *)((long)plVar78 + 0x12);
              if ((ulong)bVar61 == 0) {
                if (*(char *)((long)plVar78 + 0x1c) != '\0') {
                  lVar56 = 0;
                  do {
                    pcVar1 = (char *)((long)&local_4330 + lVar56 + 3);
                    *pcVar1 = *pcVar1 + (&ma_dr_mp3_L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float*,int)
                                          ::g_preamp)[lVar56];
                    lVar56 = lVar56 + 1;
                  } while (lVar56 != 10);
                }
              }
              else {
                cVar4 = *(char *)((long)plVar78 + 0x19);
                bVar98 = 2 - cVar3;
                cVar5 = *(char *)((long)plVar78 + 0x1a);
                uVar84 = (ulong)*(byte *)((long)plVar78 + 0x11);
                cVar6 = *(char *)((long)plVar78 + 0x1b);
                uVar70 = 0;
                do {
                  pcVar1 = (char *)((long)&local_4338 + uVar70 + uVar84);
                  *pcVar1 = *pcVar1 + (cVar4 << (bVar98 & 0x1f));
                  pcVar1 = (char *)((long)&local_4338 + uVar70 + uVar84 + 1);
                  *pcVar1 = *pcVar1 + (cVar5 << (bVar98 & 0x1f));
                  pcVar1 = (char *)((long)&local_4338 + uVar70 + uVar84 + 2);
                  *pcVar1 = *pcVar1 + (cVar6 << (bVar98 & 0x1f));
                  uVar70 = uVar70 + 3;
                } while (uVar70 < bVar61);
              }
              fVar100 = 2048.0;
              uVar87 = ((uint)((dec->header[3] & 0xe0) == 0x60) * 2 -
                       (uint)*(byte *)((long)plVar78 + 0xe)) + 0x102;
              do {
                uVar52 = 0x78;
                if ((int)uVar87 < 0x78) {
                  uVar52 = uVar87;
                }
                fVar100 = fVar100 * (float)(int)(0x40000000 >> ((byte)(uVar52 >> 2) & 0x1f)) *
                                    (float)(&ma_dr_mp3_L3_ldexp_q2(float,int)::g_expfrac)
                                           [uVar52 & 3];
                uVar65 = uVar87 - uVar52;
                bVar99 = (int)uVar52 <= (int)uVar87;
                uVar87 = uVar65;
              } while (uVar65 != 0 && bVar99);
              uVar87 = (uint)bVar61 + (uint)*(byte *)((long)plVar78 + 0x11);
              if (uVar87 != 0) {
                uVar70 = 0;
                do {
                  uVar52 = (uint)*(byte *)((long)&local_4338 + uVar70) << (cVar3 + 1U & 0x1f);
                  fVar103 = fVar100;
                  do {
                    uVar65 = 0x78;
                    if ((int)uVar52 < 0x78) {
                      uVar65 = uVar52;
                    }
                    fVar103 = fVar103 * (float)(int)(0x40000000 >> ((byte)(uVar65 >> 2) & 0x1f)) *
                                        (float)(&ma_dr_mp3_L3_ldexp_q2(float,int)::g_expfrac)
                                               [uVar65 & 3];
                    uVar76 = uVar52 - uVar65;
                    bVar99 = (int)uVar65 <= (int)uVar52;
                    uVar52 = uVar76;
                  } while (uVar76 != 0 && bVar99);
                  local_2220[uVar70] = fVar103;
                  uVar70 = uVar70 + 1;
                } while (uVar70 != uVar87);
              }
              pfVar77 = local_3420 + lVar73 * 0x240;
              uVar87 = local_3fb0.pos + 7;
              if (-1 < local_3fb0.pos) {
                uVar87 = local_3fb0.pos;
              }
              local_4358 = local_3fb0.buf;
              puVar85 = (uint *)((long)(local_3fb0.buf + ((int)uVar87 >> 3)) + 4);
              uVar87 = *(uint *)(local_3fb0.buf + ((int)uVar87 >> 3));
              uVar70 = (ulong)((uVar87 >> 0x18 | (uVar87 & 0xff0000) >> 8 | (uVar87 & 0xff00) << 8 |
                               uVar87 << 0x18) << ((byte)local_3fb0.pos & 7));
              uVar52 = (uint)*(ushort *)((long)plVar78 + 10);
              uVar87 = local_3fb0.pos | 0xfffffff8;
              pbVar93 = (byte *)*plVar78;
              if (*(ushort *)((long)plVar78 + 10) == 0) {
                auVar101._0_12_ = ZEXT812(0);
                auVar101._12_4_ = 0;
                pfVar59 = local_2220;
              }
              else {
                lVar56 = 0;
                pfVar59 = local_2220;
                uVar65 = uVar52;
                do {
                  bVar61 = *(byte *)((long)plVar78 + lVar56 + 0x13);
                  uVar76 = (uint)*(byte *)((long)plVar78 + lVar56 + 0x16);
                  sVar9 = *(short *)(ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                                     ::tabindex + (ulong)bVar61 * 2);
                  if (bVar61 < 0x10) {
                    do {
                      uVar81 = (uint)(*pbVar93 >> 1);
                      uVar52 = uVar81;
                      if ((int)uVar65 < (int)uVar81) {
                        uVar52 = uVar65;
                      }
                      fVar100 = *pfVar59;
                      auVar101 = ZEXT416((uint)fVar100);
                      do {
                        pfVar80 = pfVar77;
                        uVar86 = (uint)uVar70;
                        uVar68 = (uint)*(short *)(ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                                                  ::tabs + (uVar70 >> 0x1b) * 2 + (long)sVar9 * 2);
                        uVar84 = (ulong)uVar68;
                        if ((int)uVar68 < 0) {
                          uVar68 = 5;
                          do {
                            uVar86 = (int)uVar70 << (sbyte)uVar68;
                            uVar70 = (ulong)uVar86;
                            uVar87 = uVar87 + uVar68;
                            uVar68 = (uint)uVar84 & 7;
                            uVar69 = (uint)*(short *)(
                                                  ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                                                  ::tabs + (ulong)((uVar86 >>
                                                                   (-(char)uVar68 & 0x1fU)) -
                                                                  ((int)(uint)uVar84 >> 3)) * 2 +
                                                           (long)sVar9 * 2);
                            uVar84 = (ulong)uVar69;
                          } while ((int)uVar69 < 0);
                        }
                        uVar70 = (ulong)(uVar86 << ((byte)(uVar84 >> 8) & 0x1f));
                        uVar87 = (int)(uVar84 >> 8) + uVar87;
                        lVar66 = 0;
                        do {
                          *(float *)((long)pfVar80 + lVar66) =
                               g_ma_dr_mp3_pow43
                               [((uint)(uVar70 >> 0x1b) & 0x10 | (uint)uVar84 & 0xf) ^ 0x10] *
                               fVar100;
                          bVar99 = (uVar84 & 0xf) != 0;
                          uVar70 = (ulong)(uint)((int)uVar70 << bVar99);
                          uVar87 = uVar87 + bVar99;
                          uVar84 = uVar84 >> 4;
                          lVar66 = lVar66 + 4;
                        } while ((int)lVar66 == 4);
                        uVar68 = uVar87;
                        if (-1 < (int)uVar87) {
                          do {
                            uVar87 = *puVar85;
                            puVar85 = (uint *)((long)puVar85 + 1);
                            uVar70 = (ulong)((uint)uVar70 |
                                            (uint)(byte)uVar87 << ((byte)uVar68 & 0x1f));
                            uVar87 = uVar68 - 8;
                            bVar99 = 7 < (int)uVar68;
                            uVar68 = uVar87;
                          } while (bVar99);
                        }
                        uVar52 = uVar52 - 1;
                        pfVar77 = (float *)((long)pfVar80 + lVar66);
                      } while (uVar52 != 0);
                      pbVar93 = pbVar93 + 1;
                      pfVar59 = pfVar59 + 1;
                      uVar52 = uVar65 - uVar81;
                      if (uVar52 == 0 || (int)uVar65 < (int)uVar81) break;
                      pfVar77 = (float *)((long)pfVar80 + lVar66);
                      bVar99 = 0 < (int)uVar76;
                      uVar65 = uVar52;
                      uVar76 = uVar76 - 1;
                    } while (bVar99);
                    pfVar77 = (float *)((long)pfVar80 + lVar66);
                  }
                  else {
                    bVar61 = ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                             ::g_linbits[bVar61];
                    do {
                      uVar81 = (uint)(*pbVar93 >> 1);
                      uVar52 = uVar81;
                      if ((int)uVar65 < (int)uVar81) {
                        uVar52 = uVar65;
                      }
                      fVar100 = *pfVar59;
                      auVar101 = ZEXT416((uint)fVar100);
                      do {
                        uVar68 = (uint)uVar70;
                        sVar10 = *(short *)(ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                                            ::tabs + (uVar70 >> 0x1b) * 2 + (long)sVar9 * 2);
                        uVar86 = (uint)sVar10;
                        if (sVar10 < 0) {
                          uVar69 = 5;
                          do {
                            uVar68 = (int)uVar70 << (sbyte)uVar69;
                            uVar70 = (ulong)uVar68;
                            uVar87 = uVar87 + uVar69;
                            uVar69 = uVar86 & 7;
                            sVar10 = *(short *)(ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                                                ::tabs + (ulong)((uVar68 >> (-(char)uVar69 & 0x1fU))
                                                                - ((int)uVar86 >> 3)) * 2 +
                                                         (long)sVar9 * 2);
                            uVar86 = (uint)sVar10;
                          } while (sVar10 < 0);
                        }
                        uVar70 = (ulong)(uVar68 << ((byte)(uVar86 >> 8) & 0x1f));
                        uVar87 = (uVar86 >> 8) + uVar87;
                        iVar48 = 0;
                        do {
                          uVar68 = uVar86 & 0xf;
                          uVar69 = (uint)uVar70;
                          if (uVar68 == 0xf) {
                            uVar90 = uVar69 >> (0x20 - bVar61 & 0x1f);
                            uVar69 = uVar69 << (bVar61 & 0x1f);
                            uVar87 = uVar87 + bVar61;
                            uVar68 = uVar87;
                            if (-1 < (int)uVar87) {
                              do {
                                uVar87 = *puVar85;
                                puVar85 = (uint *)((long)puVar85 + 1);
                                uVar69 = uVar69 | (uint)(byte)uVar87 << ((byte)uVar68 & 0x1f);
                                uVar87 = uVar68 - 8;
                                bVar99 = 7 < (int)uVar68;
                                uVar68 = uVar87;
                              } while (bVar99);
                            }
                            uVar68 = uVar90 + 0xf;
                            if ((int)uVar68 < 0x81) {
                              fVar103 = g_ma_dr_mp3_pow43[(int)(uVar90 + 0x1f)];
                            }
                            else {
                              uVar34 = uVar68 * 8;
                              if (SBORROW4(uVar68,0x400) == (int)(uVar90 - 0x3f1) < 0) {
                                uVar34 = uVar68;
                              }
                              uVar90 = uVar34 * 2 & 0x40;
                              fVar103 = (float)(int)((uVar34 & 0x3f) - uVar90) /
                                        (float)(int)((uVar34 & 0x7fffffc0) + uVar90);
                              fVar103 = ((fVar103 * 0.22222222 + 1.3333334) * fVar103 +
                                        auVar132._0_4_) *
                                        g_ma_dr_mp3_pow43[(ulong)(uVar90 + uVar34 >> 6) + 0x10] *
                                        *(float *)(&DAT_0017c5b8 + (ulong)((int)uVar68 < 0x400) * 4)
                              ;
                            }
                            fVar103 = (float)(int)((int)uVar69 >> 0x1f | 1) * fVar103 * fVar100;
                          }
                          else {
                            fVar103 = g_ma_dr_mp3_pow43
                                      [((uint)(uVar70 >> 0x1b) & 0x10 | uVar68) ^ 0x10] * fVar100;
                          }
                          uVar70 = (ulong)(uVar69 << (uVar68 != 0));
                          *pfVar77 = fVar103;
                          uVar87 = uVar87 + (uVar68 != 0);
                          pfVar77 = pfVar77 + 1;
                          uVar86 = uVar86 >> 4;
                          bVar99 = iVar48 == 0;
                          iVar48 = iVar48 + 1;
                        } while (bVar99);
                        uVar68 = uVar87;
                        if (-1 < (int)uVar87) {
                          do {
                            uVar87 = *puVar85;
                            puVar85 = (uint *)((long)puVar85 + 1);
                            uVar70 = (ulong)((uint)uVar70 |
                                            (uint)(byte)uVar87 << ((byte)uVar68 & 0x1f));
                            uVar87 = uVar68 - 8;
                            bVar99 = 7 < (int)uVar68;
                            uVar68 = uVar87;
                          } while (bVar99);
                        }
                        uVar52 = uVar52 - 1;
                      } while (uVar52 != 0);
                      pbVar93 = pbVar93 + 1;
                      pfVar59 = pfVar59 + 1;
                      uVar52 = uVar65 - uVar81;
                    } while ((uVar52 != 0 && (int)uVar81 <= (int)uVar65) &&
                            (bVar99 = 0 < (int)uVar76, uVar65 = uVar52, uVar76 = uVar76 - 1, bVar99)
                            );
                  }
                  lVar56 = lVar56 + 1;
                  uVar65 = uVar52;
                } while (0 < (int)uVar52);
              }
              uVar52 = 1 - uVar52;
              puVar83 = ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                        ::tab33;
              if (*(char *)((long)plVar78 + 0x1e) == '\0') {
                puVar83 = ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                          ::tab32;
              }
              do {
                bVar61 = puVar83[uVar70 >> 0x1c];
                if ((bVar61 & 8) == 0) {
                  bVar61 = puVar83[(ulong)((uint)((int)uVar70 << 4) >> (-(bVar61 & 3) & 0x1f)) +
                                   (ulong)(bVar61 >> 3)];
                }
                uVar65 = bVar61 & 7;
                uVar76 = (int)uVar70 << (sbyte)uVar65;
                uVar70 = (ulong)uVar76;
                uVar87 = uVar65 + uVar87;
                if ((long)(lVar55 + (ulong)uVar8) <
                    (long)(int)uVar87 + ((long)puVar85 - (long)local_3fb0.buf) * 8 + -0x18) {
LAB_00159f66:
                  bVar99 = false;
                }
                else {
                  uVar52 = uVar52 - 1;
                  if (uVar52 == 0) {
                    bVar98 = *pbVar93;
                    pbVar93 = pbVar93 + 1;
                    uVar52 = 0;
                    if (bVar98 < 2) goto LAB_00159f66;
                    auVar101 = ZEXT416((uint)*pfVar59);
                    pfVar59 = pfVar59 + 1;
                    uVar52 = (uint)(bVar98 >> 1);
                  }
                  if (0x7f < bVar61) {
                    auVar105 = auVar101;
                    if ((int)uVar76 < 0) {
                      auVar105._0_4_ = auVar101._0_4_ ^ 0x80000000;
                      auVar105._4_4_ = 0;
                      auVar105._8_4_ = auVar101._8_4_ ^ 0x80000000;
                      auVar105._12_4_ = auVar101._12_4_ ^ 0x80000000;
                    }
                    *pfVar77 = auVar105._0_4_;
                    uVar70 = (ulong)(uVar76 * 2);
                    uVar87 = uVar87 + 1;
                  }
                  if ((bVar61 & 0x40) != 0) {
                    auVar106 = auVar101;
                    if ((int)uVar70 < 0) {
                      auVar106._0_4_ = auVar101._0_4_ ^ 0x80000000;
                      auVar106._4_4_ = 0;
                      auVar106._8_4_ = auVar101._8_4_ ^ 0x80000000;
                      auVar106._12_4_ = auVar101._12_4_ ^ 0x80000000;
                    }
                    pfVar77[1] = auVar106._0_4_;
                    uVar70 = (ulong)(uint)((int)uVar70 * 2);
                    uVar87 = uVar87 + 1;
                  }
                  uVar52 = uVar52 - 1;
                  if (uVar52 == 0) {
                    bVar98 = *pbVar93;
                    pbVar93 = pbVar93 + 1;
                    uVar52 = 0;
                    if (bVar98 < 2) goto LAB_00159f66;
                    auVar101 = ZEXT416((uint)*pfVar59);
                    pfVar59 = pfVar59 + 1;
                    uVar52 = (uint)(bVar98 >> 1);
                  }
                  if ((bVar61 & 0x20) != 0) {
                    auVar107 = auVar101;
                    if ((int)uVar70 < 0) {
                      auVar107._0_4_ = auVar101._0_4_ ^ 0x80000000;
                      auVar107._4_4_ = 0;
                      auVar107._8_4_ = auVar101._8_4_ ^ 0x80000000;
                      auVar107._12_4_ = auVar101._12_4_ ^ 0x80000000;
                    }
                    pfVar77[2] = auVar107._0_4_;
                    uVar70 = (ulong)(uint)((int)uVar70 * 2);
                    uVar87 = uVar87 + 1;
                  }
                  if ((bVar61 & 0x10) != 0) {
                    auVar108 = auVar101;
                    if ((int)uVar70 < 0) {
                      auVar108._0_4_ = auVar101._0_4_ ^ 0x80000000;
                      auVar108._4_4_ = 0;
                      auVar108._8_4_ = auVar101._8_4_ ^ 0x80000000;
                      auVar108._12_4_ = auVar101._12_4_ ^ 0x80000000;
                    }
                    pfVar77[3] = auVar108._0_4_;
                    uVar70 = (ulong)(uint)((int)uVar70 * 2);
                    uVar87 = uVar87 + 1;
                  }
                  bVar99 = true;
                  uVar65 = uVar87;
                  if (-1 < (int)uVar87) {
                    do {
                      uVar87 = *puVar85;
                      puVar85 = (uint *)((long)puVar85 + 1);
                      uVar70 = (ulong)((uint)uVar70 | (uint)(byte)uVar87 << ((byte)uVar65 & 0x1f));
                      uVar87 = uVar65 - 8;
                      bVar12 = 7 < (int)uVar65;
                      uVar65 = uVar87;
                    } while (bVar12);
                  }
                }
                pfVar77 = pfVar77 + 4;
              } while (bVar99);
              local_3fb0.pos = (uint)(lVar55 + (ulong)uVar8);
              lVar73 = lVar73 + 1;
            } while (lVar73 != local_4350);
          }
          bVar61 = dec->header[3];
          if ((bVar61 & 0x10) == 0) {
            if ((bVar61 & 0xe0) == 0x60) {
              uVar70 = 0xfffffffffffffffc;
              do {
                fVar100 = afStack_3410[uVar70];
                fVar103 = afStack_3410[uVar70 + 1];
                fVar104 = afStack_3410[uVar70 + 2];
                fVar35 = afStack_3410[uVar70 + 3];
                auVar102 = *(undefined1 (*) [16])(afStack_2b10 + uVar70);
                auVar121._0_4_ = fVar100 + auVar102._0_4_;
                auVar121._4_4_ = fVar103 + auVar102._4_4_;
                auVar121._8_4_ = fVar104 + auVar102._8_4_;
                auVar121._12_4_ = fVar35 + auVar102._12_4_;
                *(undefined1 (*) [16])(afStack_3410 + uVar70) = auVar121;
                afStack_2b10[uVar70] = fVar100 - auVar102._0_4_;
                afStack_2b10[uVar70 + 1] = fVar103 - auVar102._4_4_;
                afStack_2b10[uVar70 + 2] = fVar104 - auVar102._8_4_;
                local_2220[uVar70 - 0x239] = fVar35 - auVar102._12_4_;
                uVar70 = uVar70 + 4;
              } while (uVar70 < 0x239);
            }
          }
          else {
            bVar98 = *(byte *)((long)local_4378 + 0x11);
            bVar45 = *(byte *)((long)local_4378 + 0x12);
            lVar73 = *local_4378;
            local_4330 = -NAN;
            _local_4338 = 0xffffffffffffffff;
            uVar87 = (uint)bVar45 + (uint)bVar98;
            if (uVar87 != 0) {
              uVar70 = 0;
              puVar83 = local_2b20;
              do {
                uVar84 = (ulong)*(byte *)(lVar73 + uVar70);
                if (uVar84 != 0) {
                  uVar95 = 0;
                  do {
                    if (((*(float *)(puVar83 + uVar95 * 4) != 0.0) ||
                        (*(float *)(puVar83 + uVar95 * 4 + 4) != 0.0)) ||
                       (NAN(*(float *)(puVar83 + uVar95 * 4 + 4)))) {
                      (&local_4338)[(uint)((int)uVar70 + (int)((uVar70 & 0xffffffff) / 3) * -3)] =
                           (int)uVar70;
                      break;
                    }
                    uVar95 = uVar95 + 2;
                  } while (uVar95 < uVar84);
                }
                puVar83 = puVar83 + uVar84 * 4;
                uVar70 = uVar70 + 1;
              } while (uVar70 != uVar87);
            }
            if (bVar98 != 0) {
              if ((int)fStack_4334 < (int)local_4338) {
                fStack_4334 = local_4338;
              }
              if ((int)fStack_4334 <= (int)local_4330) {
                fStack_4334 = local_4330;
              }
              local_4330 = fStack_4334;
              _local_4338 = CONCAT44(fStack_4334,fStack_4334);
            }
            uVar52 = (uint)(bVar45 != 0) * 2 + 1;
            lVar73 = (long)(int)(uVar87 - uVar52) + -0x59;
            uVar70 = 0;
            do {
              if ((int)(&local_4338)[uVar70] < (int)(uVar87 + uVar52 * -2 + (int)uVar70)) {
                bVar98 = local_59[uVar70 + (lVar73 - (ulong)uVar52) + 0x59];
              }
              else {
                bVar98 = (char)(dec->header[1] << 4) >> 7 & 3;
              }
              local_59[uVar70 + lVar73 + 0x59] = bVar98;
              uVar70 = uVar70 + 1;
            } while (uVar70 != uVar52);
            pbVar93 = (byte *)*local_4378;
            bVar98 = dec->header[1];
            bVar45 = 7;
            if ((bVar98 & 8) == 0) {
              bVar45 = 0x40;
            }
            bVar60 = *pbVar93;
            if (bVar60 != 0) {
              uVar11 = *(undefined2 *)((long)local_4378 + 0x2c);
              fVar100 = *(float *)(&DAT_0017c5c0 + (ulong)((bVar61 & 0x20) == 0) * 4);
              uVar70 = 0;
              pfVar77 = local_3420;
              do {
                iVar48 = (int)uVar70;
                if ((int)(&local_4338)[(uint)(iVar48 + (int)(uVar70 / 3) * -3)] < iVar48) {
                  bVar7 = local_59[uVar70];
                  if (bVar45 <= bVar7) goto LAB_0015a339;
                  if ((bVar98 & 8) == 0) {
                    auVar109 = auVar132;
                    uVar87 = (bVar7 + 1 >> 1) << ((byte)uVar11 & 1);
                    do {
                      auVar102 = auVar109;
                      uVar52 = 0x78;
                      if ((int)uVar87 < 0x78) {
                        uVar52 = uVar87;
                      }
                      auVar109._4_12_ = auVar102._4_12_;
                      auVar109._0_4_ =
                           auVar102._0_4_ *
                           (float)(int)(0x40000000 >> ((byte)(uVar52 >> 2) & 0x1f)) *
                           (float)(&ma_dr_mp3_L3_ldexp_q2(float,int)::g_expfrac)[uVar52 & 3];
                      uVar65 = uVar87 - uVar52;
                      bVar99 = (int)uVar52 <= (int)uVar87;
                      uVar87 = uVar65;
                    } while (uVar65 != 0 && bVar99);
                    auVar122 = auVar132;
                    if ((bVar7 & 1) != 0) {
                      auVar122._4_4_ = 0;
                      auVar122._0_4_ = auVar109._0_4_;
                      auVar122._8_4_ = auVar102._8_4_;
                      auVar122._12_4_ = auVar102._12_4_;
                      auVar109 = auVar132;
                    }
                    fVar104 = auVar109._0_4_;
                    fVar103 = auVar122._0_4_;
                  }
                  else {
                    fVar103 = *(float *)(ma_dr_mp3_L3_stereo_process(float*,unsigned_char_const*,unsigned_char_const*,unsigned_char_const*,int*,int)
                                         ::g_pan + (ulong)bVar7 * 8);
                    fVar104 = *(float *)(ma_dr_mp3_L3_stereo_process(float*,unsigned_char_const*,unsigned_char_const*,unsigned_char_const*,int*,int)
                                         ::g_pan + (ulong)bVar7 * 8 + 4);
                  }
                  uVar84 = 0;
                  do {
                    pfVar77[uVar84 + 0x240] = fVar104 * fVar100 * pfVar77[uVar84];
                    pfVar77[uVar84] = pfVar77[uVar84] * fVar103 * fVar100;
                    uVar84 = uVar84 + 1;
                  } while (bVar60 != uVar84);
                }
                else {
LAB_0015a339:
                  if ((bVar61 & 0x20) != 0) {
                    uVar84 = 0;
                    if (3 < bVar60) {
                      uVar84 = 0;
                      do {
                        pfVar59 = pfVar77 + uVar84;
                        fVar103 = *pfVar59;
                        fVar104 = pfVar59[1];
                        fVar35 = pfVar59[2];
                        fVar36 = pfVar59[3];
                        auVar102 = *(undefined1 (*) [16])(pfVar77 + uVar84 + 0x240);
                        pfVar59 = pfVar77 + uVar84;
                        *pfVar59 = fVar103 + auVar102._0_4_;
                        pfVar59[1] = fVar104 + auVar102._4_4_;
                        pfVar59[2] = fVar35 + auVar102._8_4_;
                        pfVar59[3] = fVar36 + auVar102._12_4_;
                        auVar110._0_4_ = fVar103 - auVar102._0_4_;
                        auVar110._4_4_ = fVar104 - auVar102._4_4_;
                        auVar110._8_4_ = fVar35 - auVar102._8_4_;
                        auVar110._12_4_ = fVar36 - auVar102._12_4_;
                        *(undefined1 (*) [16])(pfVar77 + uVar84 + 0x240) = auVar110;
                        uVar84 = uVar84 + 4;
                      } while ((long)uVar84 < (long)(int)(bVar60 - 3));
                    }
                    if ((int)uVar84 < (int)(uint)bVar60) {
                      uVar84 = uVar84 & 0xffffffff;
                      do {
                        fVar103 = pfVar77[uVar84];
                        pfVar77[uVar84] = fVar103 + pfVar77[uVar84 + 0x240];
                        pfVar77[uVar84 + 0x240] = fVar103 - pfVar77[uVar84 + 0x240];
                        uVar84 = uVar84 + 1;
                      } while (bVar60 != uVar84);
                    }
                  }
                }
                pfVar77 = pfVar77 + pbVar93[uVar70];
                uVar70 = (ulong)(iVar48 + 1);
                bVar60 = pbVar93[uVar70];
              } while (bVar60 != 0);
            }
          }
          pmVar89 = &local_3fb0;
          if (0 < (int)local_4350) {
            puVar83 = local_33d4;
            pauVar75 = (undefined1 (*) [16])local_33e8;
            lVar73 = 0;
            plVar78 = local_4378;
            do {
              lVar55 = plVar78[2];
              iVar48 = (uint)((char)lVar55 != '\0') * 2 <<
                       ((byte)(((dec->header[1] >> 3 & 1) + ((dec->header[1] >> 4 & 1) != 0)) *
                               '\x03' + (dec->header[2] >> 2 & 3)) == '\x02');
              if (*(char *)((long)plVar78 + 0x12) == '\0') {
                iVar63 = 0x1f;
              }
              else {
                __dest_00 = (void *)((long)local_3420 +
                                    (ulong)(uint)(iVar48 * 0x48) + lVar73 * 0x900);
                bVar61 = *(byte *)(*plVar78 + (ulong)*(byte *)((long)plVar78 + 0x11));
                pfVar77 = local_2180;
                if (bVar61 != 0) {
                  lVar56 = *plVar78 + (ulong)*(byte *)((long)plVar78 + 0x11);
                  pvVar79 = __dest_00;
                  do {
                    uVar70 = (ulong)bVar61;
                    lVar66 = 0;
                    do {
                      *pfVar77 = *(float *)((long)pvVar79 + lVar66);
                      pfVar77[1] = *(float *)((long)pvVar79 + lVar66 + uVar70 * 4);
                      pfVar77[2] = *(float *)((long)pvVar79 + lVar66 + uVar70 * 8);
                      pfVar77 = pfVar77 + 3;
                      lVar66 = lVar66 + 4;
                    } while (((uint)bVar61 + (uint)(uVar70 == 0)) * 4 != (int)lVar66);
                    pvVar79 = (void *)((long)pvVar79 + lVar66 + uVar70 * 8);
                    bVar61 = *(byte *)(lVar56 + 3);
                    lVar56 = lVar56 + 3;
                  } while (bVar61 != 0);
                }
                iVar63 = iVar48 + -1;
                memcpy(__dest_00,local_2180,(long)pfVar77 - (long)local_2180);
              }
              pmVar57 = pmVar89;
              pauVar64 = pauVar75;
              if (0 < iVar63) {
                do {
                  lVar56 = 0;
                  pauVar67 = pauVar64;
                  do {
                    piVar2 = &pmVar57[0xbd].pos + lVar56;
                    fVar100 = (float)*piVar2;
                    fVar103 = (float)piVar2[1];
                    fVar104 = (float)piVar2[2];
                    fVar35 = (float)piVar2[3];
                    fVar36 = *(float *)*pauVar67;
                    fVar37 = *(float *)(*pauVar67 + 4);
                    fVar38 = *(float *)(*pauVar67 + 8);
                    fVar39 = *(float *)(*pauVar67 + 0xc);
                    auVar102 = *(undefined1 (*) [16])
                                (ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar56 * 4);
                    lVar66 = lVar56 * 4;
                    fVar40 = *(float *)(ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar66 + 0x20);
                    fVar41 = *(float *)(ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar66 + 0x24);
                    fVar42 = *(float *)(ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar66 + 0x28);
                    fVar43 = *(float *)(ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar66 + 0x2c);
                    piVar2 = &pmVar57[0xbd].pos + lVar56;
                    *piVar2 = (int)(fVar100 * auVar102._0_4_ - fVar39 * fVar40);
                    piVar2[1] = (int)(fVar103 * auVar102._4_4_ - fVar38 * fVar41);
                    piVar2[2] = (int)(fVar104 * auVar102._8_4_ - fVar37 * fVar42);
                    piVar2[3] = (int)(fVar35 * auVar102._12_4_ - fVar36 * fVar43);
                    auVar111._4_4_ = fVar37 * auVar102._8_4_ + fVar104 * fVar42;
                    auVar111._0_4_ = fVar36 * auVar102._12_4_ + fVar35 * fVar43;
                    auVar111._8_4_ = fVar38 * auVar102._4_4_ + fVar103 * fVar41;
                    auVar111._12_4_ = fVar39 * auVar102._0_4_ + fVar100 * fVar40;
                    *pauVar67 = auVar111;
                    lVar56 = lVar56 + 4;
                    pauVar67 = pauVar67 + -1;
                  } while (lVar56 == 4);
                  bVar99 = 1 < iVar63;
                  pmVar57 = (ma_dr_mp3_bs *)&pmVar57[4].pos;
                  pauVar64 = (undefined1 (*) [16])(pauVar64[4] + 8);
                  iVar63 = iVar63 + -1;
                } while (bVar99);
              }
              pfVar77 = local_3420 + lVar73 * 0x240;
              overlap = dec->mdct_overlap + lVar73;
              cVar3 = *(char *)((long)plVar78 + 0xf);
              if ((char)lVar55 != '\0') {
                ma_dr_mp3_L3_imdct36
                          (pfVar77,*overlap,
                           (float *)ma_dr_mp3_L3_imdct_gr(float*,float*,unsigned_int,unsigned_int)::
                                    g_mdct_window,iVar48);
                pfVar77 = (float *)((long)pfVar77 + (ulong)(uint)(iVar48 * 0x48));
                overlap = (float (*) [288])((long)*overlap + (ulong)(uint)(iVar48 * 0x24));
              }
              local_4378 = plVar78;
              if (cVar3 == '\x02') {
                iVar48 = 0x21 - iVar48;
                lVar55 = 0;
                do {
                  pfVar59 = (float *)((long)pfVar77 + lVar55 * 2);
                  pfVar80 = pfVar59;
                  pfVar82 = (float *)&local_4338;
                  for (lVar56 = 0x12; lVar56 != 0; lVar56 = lVar56 + -1) {
                    *pfVar82 = *pfVar80;
                    pfVar80 = pfVar80 + (ulong)bVar46 * -2 + 1;
                    pfVar82 = pfVar82 + (ulong)bVar46 * -2 + 1;
                  }
                  pfVar80 = (float *)((long)*overlap + lVar55 + 0x18);
                  *(undefined8 *)(pfVar59 + 4) = *(undefined8 *)(pfVar80 + -2);
                  uVar44 = *(undefined8 *)(pfVar80 + -4);
                  *(undefined8 *)pfVar59 = *(undefined8 *)(pfVar80 + -6);
                  *(undefined8 *)(pfVar59 + 2) = uVar44;
                  ma_dr_mp3_L3_imdct12
                            ((float *)&local_4338,(float *)((long)pfVar77 + lVar55 * 2 + 0x18),
                             pfVar80);
                  ma_dr_mp3_L3_imdct12
                            (&fStack_4334,(float *)((long)pfVar77 + lVar55 * 2 + 0x30),pfVar80);
                  ma_dr_mp3_L3_imdct12
                            ((float *)&local_4330,(float *)((long)*overlap + lVar55),pfVar80);
                  iVar48 = iVar48 + -1;
                  lVar55 = lVar55 + 0x24;
                } while (1 < iVar48);
              }
              else {
                ma_dr_mp3_L3_imdct36
                          (pfVar77,*overlap,
                           (float *)(ma_dr_mp3_L3_imdct_gr(float*,float*,unsigned_int,unsigned_int)
                                     ::g_mdct_window + (ulong)(cVar3 == '\x03') * 0x48),
                           0x20 - iVar48);
              }
              puVar58 = puVar83;
              uVar87 = 0;
              do {
                uVar70 = 0xffffffffffffffff;
                do {
                  *(uint *)(puVar58 + uVar70 * 4 + 4) =
                       *(uint *)(puVar58 + uVar70 * 4 + 4) ^ (uint)DAT_0017ad70;
                  uVar70 = uVar70 + 2;
                } while (uVar70 < 0x10);
                puVar58 = puVar58 + 0x90;
                bVar99 = uVar87 < 0x1e;
                uVar87 = uVar87 + 2;
              } while (bVar99);
              lVar73 = lVar73 + 1;
              plVar78 = local_4378 + 4;
              pauVar75 = pauVar75 + 0x90;
              pmVar89 = pmVar89 + 0x90;
              puVar83 = puVar83 + 0x900;
            } while (lVar73 != local_4350);
          }
          pmVar97 = local_4360;
          pmVar88 = local_4370;
          ma_dr_mp3d_synth_granule
                    (local_4348,local_3420,0x12,local_4360->channels,local_4370,local_2180);
          if ((local_4368[1] & 8) == 0) break;
          pmVar88 = pmVar88 + (long)pmVar97->channels * 0x240;
          uVar70 = (ulong)((int)local_4340 + 1);
        } while ((int)local_4340 == 0);
      }
      uVar87 = local_3fb0.pos + 7U >> 3;
      uVar65 = ((uint)local_3fb0.limit >> 3) - uVar87;
      uVar52 = 0x1ff;
      if ((int)uVar65 < 0x1ff) {
        uVar52 = uVar65;
      }
      if (0 < (int)uVar65) {
        if (0x1ff < (int)uVar65) {
          uVar87 = ((uint)local_3fb0.limit >> 3) - 0x1ff;
        }
        memcpy(dec->reserv_buf,local_3fa0 + uVar87,(ulong)uVar52);
      }
      uVar47 = (uint)((int)uVar72 <= (int)uVar47);
      dec->reserv = uVar52;
      bVar99 = true;
    }
    local_4388.pos = 0;
  }
  else {
    if (local_4370 == (ma_dr_mp3d_sample_t *)0x0) {
      local_4388.pos = 0x180;
      if ((~bVar61 & 6) != 0) {
        local_4388.pos = 0x480 >> ((bVar61 & 0xe) == 2);
      }
      bVar99 = false;
    }
    else {
      bVar46 = pmVar92[3] >> 6;
      if (bVar46 == 3) {
        uVar47 = 0;
      }
      else if (bVar46 == 1) {
        uVar47 = (pmVar92[3] >> 2 & 0xc) + 4;
      }
      else {
        uVar47 = 0x20;
      }
      if ((~bVar61 & 6) == 0) {
        puVar83 = &ma_dr_mp3_L12_subband_alloc_table(unsigned_char_const*,ma_dr_mp3_L12_scale_info*)
                   ::g_alloc_L1;
        uVar52 = 0x20;
      }
      else if ((bVar61 & 8) == 0) {
        puVar83 = &ma_dr_mp3_L12_subband_alloc_table(unsigned_char_const*,ma_dr_mp3_L12_scale_info*)
                   ::g_alloc_L2M2;
        uVar52 = 0x1e;
      }
      else {
        bVar45 = pmVar92[2] >> 2 & 3;
        bVar98 = *(byte *)((ulong)(pmVar92[2] >> 4) +
                          (long)(int)((bVar61 >> 1 & 3) - 1) * 0xf + 0x17ea2d);
        uVar87 = 0xc0;
        if (bVar98 != 0) {
          uVar87 = (uint)bVar98 + (uint)bVar98 >> (bVar46 != 3);
        }
        if (uVar87 < 0x38) {
          uVar52 = (uint)(bVar45 == 2) * 4 + 8;
          puVar83 = (undefined1 *)
                    &ma_dr_mp3_L12_subband_alloc_table(unsigned_char_const*,ma_dr_mp3_L12_scale_info*)
                     ::g_alloc_L2M1_lowrate;
        }
        else {
          uVar52 = 0x1b;
          if (bVar45 != 1) {
            uVar52 = (uint)(0x5f < uVar87) * 3 + 0x1b;
          }
          puVar83 = ma_dr_mp3_L12_subband_alloc_table(unsigned_char_const*,ma_dr_mp3_L12_scale_info*)
                    ::g_alloc_L2M1;
        }
      }
      local_4038 = (byte)uVar52;
      uVar87 = uVar52;
      if (uVar47 < uVar52) {
        uVar87 = uVar47;
      }
      uVar70 = (ulong)uVar87;
      local_4037 = (byte)uVar87;
      uVar95 = 0;
      puVar58 = ma_dr_mp3_L12_read_scale_info(unsigned_char_const*,ma_dr_mp3_bs*,ma_dr_mp3_L12_scale_info*)
                ::g_bitalloc_code_tab;
      uVar72 = 0;
      uVar84 = 0;
      do {
        if (uVar95 == uVar84) {
          uVar84 = (ulong)((int)uVar84 + (uint)(byte)puVar83[2]);
          uVar72 = (uint)(byte)puVar83[1];
          puVar58 = ma_dr_mp3_L12_read_scale_info(unsigned_char_const*,ma_dr_mp3_bs*,ma_dr_mp3_L12_scale_info*)
                    ::g_bitalloc_code_tab + (byte)*puVar83;
          puVar83 = puVar83 + 3;
        }
        mVar53 = ma_dr_mp3_bs_get_bits(&local_4388,uVar72);
        bVar46 = puVar58[mVar53];
        local_4036[uVar95 * 2] = bVar46;
        if (uVar95 < uVar70) {
          mVar53 = ma_dr_mp3_bs_get_bits(&local_4388,uVar72);
          bVar46 = puVar58[mVar53];
        }
        if (uVar47 == 0) {
          bVar46 = 0;
        }
        local_4036[uVar95 * 2 + 1] = bVar46;
        uVar95 = uVar95 + 1;
      } while (uVar52 != uVar95);
      uVar84 = 0;
      pbVar93 = local_4036;
      do {
        bVar46 = (local_4036[uVar84] == 0) << 2 | 2;
        if ((local_4036[uVar84] != 0) && ((bVar61 & 6) != 6)) {
          mVar53 = ma_dr_mp3_bs_get_bits(&local_4388,2);
          bVar46 = (byte)mVar53;
        }
        abStack_3ff6[uVar84] = bVar46;
        uVar84 = uVar84 + 1;
      } while (uVar52 * 2 != uVar84);
      pfVar77 = (float *)&local_4338;
      uVar84 = 0;
      do {
        bVar46 = *pbVar93;
        uVar47 = 0;
        if (bVar46 != 0) {
          uVar47 = 0x13U >> (abStack_3ff6[uVar84] & 0x1f) | 4;
        }
        pbVar93 = pbVar93 + 1;
        fVar100 = 0.0;
        uVar72 = 4;
        do {
          if ((uVar72 & uVar47) != 0) {
            mVar53 = ma_dr_mp3_bs_get_bits(&local_4388,6);
            fVar100 = (float)(int)(0x200000 >> ((byte)((int)mVar53 / 3) & 0x1f)) *
                      *(float *)(ma_dr_mp3_L12_read_scalefactors(ma_dr_mp3_bs*,unsigned_char*,unsigned_char*,int,float*)
                                 ::g_deq_L12 +
                                (long)(int)((int)mVar53 % 3 + (uint)bVar46 + (uint)bVar46 * 2 + -6)
                                * 4);
          }
          *pfVar77 = fVar100;
          pfVar77 = pfVar77 + 1;
          bVar99 = 1 < uVar72;
          uVar72 = uVar72 >> 1;
        } while (bVar99);
        uVar84 = uVar84 + 1;
      } while (uVar84 != uVar52 * 2);
      if (uVar87 < uVar52) {
        lVar55 = uVar52 - uVar70;
        lVar73 = lVar55 + -1;
        auVar102._8_4_ = (int)lVar73;
        auVar102._0_8_ = lVar73;
        auVar102._12_4_ = (int)((ulong)lVar73 >> 0x20);
        lVar73 = uVar70 * 2;
        uVar70 = 0;
        do {
          auVar133._8_4_ = (int)uVar70;
          auVar133._0_8_ = uVar70;
          auVar133._12_4_ = (int)(uVar70 >> 0x20);
          auVar135 = auVar102 ^ _DAT_0017ad70;
          auVar137 = (auVar133 | _DAT_0017ad60) ^ _DAT_0017ad70;
          iVar48 = auVar135._0_4_;
          iVar50 = -(uint)(iVar48 < auVar137._0_4_);
          iVar63 = auVar135._4_4_;
          auVar139._4_4_ = -(uint)(iVar63 < auVar137._4_4_);
          iVar71 = auVar135._8_4_;
          iVar153 = -(uint)(iVar71 < auVar137._8_4_);
          iVar49 = auVar135._12_4_;
          auVar139._12_4_ = -(uint)(iVar49 < auVar137._12_4_);
          auVar112._4_4_ = iVar50;
          auVar112._0_4_ = iVar50;
          auVar112._8_4_ = iVar153;
          auVar112._12_4_ = iVar153;
          auVar112 = pshuflw(in_XMM1,auVar112,0xe8);
          auVar138._4_4_ = -(uint)(auVar137._4_4_ == iVar63);
          auVar138._12_4_ = -(uint)(auVar137._12_4_ == iVar49);
          auVar138._0_4_ = auVar138._4_4_;
          auVar138._8_4_ = auVar138._12_4_;
          auVar123 = pshuflw(in_XMM2,auVar138,0xe8);
          auVar139._0_4_ = auVar139._4_4_;
          auVar139._8_4_ = auVar139._12_4_;
          auVar137 = pshuflw(auVar112,auVar139,0xe8);
          auVar135._8_4_ = 0xffffffff;
          auVar135._0_8_ = 0xffffffffffffffff;
          auVar135._12_4_ = 0xffffffff;
          auVar135 = (auVar137 | auVar123 & auVar112) ^ auVar135;
          auVar135 = packssdw(auVar135,auVar135);
          if ((auVar135 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_4036[uVar70 * 2 + lVar73 + 1] = 0;
          }
          auVar123._4_4_ = iVar50;
          auVar123._0_4_ = iVar50;
          auVar123._8_4_ = iVar153;
          auVar123._12_4_ = iVar153;
          auVar139 = auVar138 & auVar123 | auVar139;
          auVar135 = packssdw(auVar139,auVar139);
          auVar137._8_4_ = 0xffffffff;
          auVar137._0_8_ = 0xffffffffffffffff;
          auVar137._12_4_ = 0xffffffff;
          auVar135 = packssdw(auVar135 ^ auVar137,auVar135 ^ auVar137);
          auVar135 = packsswb(auVar135,auVar135);
          if ((auVar135._0_4_ >> 8 & 1) != 0) {
            local_4036[uVar70 * 2 + lVar73 + 3] = 0;
          }
          auVar135 = (auVar133 | _DAT_0017ad90) ^ _DAT_0017ad70;
          auVar124._0_4_ = -(uint)(iVar48 < auVar135._0_4_);
          auVar124._4_4_ = -(uint)(iVar63 < auVar135._4_4_);
          auVar124._8_4_ = -(uint)(iVar71 < auVar135._8_4_);
          auVar124._12_4_ = -(uint)(iVar49 < auVar135._12_4_);
          auVar140._4_4_ = auVar124._0_4_;
          auVar140._0_4_ = auVar124._0_4_;
          auVar140._8_4_ = auVar124._8_4_;
          auVar140._12_4_ = auVar124._8_4_;
          iVar50 = -(uint)(auVar135._4_4_ == iVar63);
          iVar153 = -(uint)(auVar135._12_4_ == iVar49);
          auVar22._4_4_ = iVar50;
          auVar22._0_4_ = iVar50;
          auVar22._8_4_ = iVar153;
          auVar22._12_4_ = iVar153;
          auVar150._4_4_ = auVar124._4_4_;
          auVar150._0_4_ = auVar124._4_4_;
          auVar150._8_4_ = auVar124._12_4_;
          auVar150._12_4_ = auVar124._12_4_;
          auVar135 = auVar22 & auVar140 | auVar150;
          auVar135 = packssdw(auVar135,auVar135);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar135 = packssdw(auVar135 ^ auVar13,auVar135 ^ auVar13);
          auVar135 = packsswb(auVar135,auVar135);
          if ((auVar135._0_4_ >> 0x10 & 1) != 0) {
            local_4036[uVar70 * 2 + lVar73 + 5] = 0;
          }
          auVar135 = pshufhw(auVar135,auVar140,0x84);
          auVar23._4_4_ = iVar50;
          auVar23._0_4_ = iVar50;
          auVar23._8_4_ = iVar153;
          auVar23._12_4_ = iVar153;
          auVar137 = pshufhw(auVar124,auVar23,0x84);
          auVar112 = pshufhw(auVar135,auVar150,0x84);
          auVar113._8_4_ = 0xffffffff;
          auVar113._0_8_ = 0xffffffffffffffff;
          auVar113._12_4_ = 0xffffffff;
          auVar113 = (auVar112 | auVar137 & auVar135) ^ auVar113;
          auVar135 = packssdw(auVar113,auVar113);
          auVar135 = packsswb(auVar135,auVar135);
          if ((auVar135._0_4_ >> 0x18 & 1) != 0) {
            local_4036[uVar70 * 2 + lVar73 + 7] = 0;
          }
          auVar135 = (auVar133 | _DAT_001811a0) ^ _DAT_0017ad70;
          auVar125._0_4_ = -(uint)(iVar48 < auVar135._0_4_);
          auVar125._4_4_ = -(uint)(iVar63 < auVar135._4_4_);
          auVar125._8_4_ = -(uint)(iVar71 < auVar135._8_4_);
          auVar125._12_4_ = -(uint)(iVar49 < auVar135._12_4_);
          auVar24._4_4_ = auVar125._0_4_;
          auVar24._0_4_ = auVar125._0_4_;
          auVar24._8_4_ = auVar125._8_4_;
          auVar24._12_4_ = auVar125._8_4_;
          auVar137 = pshuflw(auVar150,auVar24,0xe8);
          auVar114._0_4_ = -(uint)(auVar135._0_4_ == iVar48);
          auVar114._4_4_ = -(uint)(auVar135._4_4_ == iVar63);
          auVar114._8_4_ = -(uint)(auVar135._8_4_ == iVar71);
          auVar114._12_4_ = -(uint)(auVar135._12_4_ == iVar49);
          auVar141._4_4_ = auVar114._4_4_;
          auVar141._0_4_ = auVar114._4_4_;
          auVar141._8_4_ = auVar114._12_4_;
          auVar141._12_4_ = auVar114._12_4_;
          auVar135 = pshuflw(auVar114,auVar141,0xe8);
          auVar142._4_4_ = auVar125._4_4_;
          auVar142._0_4_ = auVar125._4_4_;
          auVar142._8_4_ = auVar125._12_4_;
          auVar142._12_4_ = auVar125._12_4_;
          auVar112 = pshuflw(auVar125,auVar142,0xe8);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar135 = packssdw(auVar135 & auVar137,(auVar112 | auVar135 & auVar137) ^ auVar14);
          auVar135 = packsswb(auVar135,auVar135);
          if ((auVar135 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_4036[uVar70 * 2 + lVar73 + 9] = 0;
          }
          auVar25._4_4_ = auVar125._0_4_;
          auVar25._0_4_ = auVar125._0_4_;
          auVar25._8_4_ = auVar125._8_4_;
          auVar25._12_4_ = auVar125._8_4_;
          auVar142 = auVar141 & auVar25 | auVar142;
          auVar112 = packssdw(auVar142,auVar142);
          auVar15._8_4_ = 0xffffffff;
          auVar15._0_8_ = 0xffffffffffffffff;
          auVar15._12_4_ = 0xffffffff;
          auVar135 = packssdw(auVar135,auVar112 ^ auVar15);
          auVar135 = packsswb(auVar135,auVar135);
          if ((auVar135._4_2_ >> 8 & 1) != 0) {
            local_4036[uVar70 * 2 + lVar73 + 0xb] = 0;
          }
          auVar135 = (auVar133 | _DAT_00181190) ^ _DAT_0017ad70;
          auVar126._0_4_ = -(uint)(iVar48 < auVar135._0_4_);
          auVar126._4_4_ = -(uint)(iVar63 < auVar135._4_4_);
          auVar126._8_4_ = -(uint)(iVar71 < auVar135._8_4_);
          auVar126._12_4_ = -(uint)(iVar49 < auVar135._12_4_);
          auVar143._4_4_ = auVar126._0_4_;
          auVar143._0_4_ = auVar126._0_4_;
          auVar143._8_4_ = auVar126._8_4_;
          auVar143._12_4_ = auVar126._8_4_;
          iVar50 = -(uint)(auVar135._4_4_ == iVar63);
          iVar153 = -(uint)(auVar135._12_4_ == iVar49);
          auVar26._4_4_ = iVar50;
          auVar26._0_4_ = iVar50;
          auVar26._8_4_ = iVar153;
          auVar26._12_4_ = iVar153;
          auVar151._4_4_ = auVar126._4_4_;
          auVar151._0_4_ = auVar126._4_4_;
          auVar151._8_4_ = auVar126._12_4_;
          auVar151._12_4_ = auVar126._12_4_;
          auVar135 = auVar26 & auVar143 | auVar151;
          auVar135 = packssdw(auVar135,auVar135);
          auVar16._8_4_ = 0xffffffff;
          auVar16._0_8_ = 0xffffffffffffffff;
          auVar16._12_4_ = 0xffffffff;
          auVar135 = packssdw(auVar135 ^ auVar16,auVar135 ^ auVar16);
          auVar135 = packsswb(auVar135,auVar135);
          if ((auVar135 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_4036[uVar70 * 2 + lVar73 + 0xd] = 0;
          }
          auVar135 = pshufhw(auVar135,auVar143,0x84);
          auVar27._4_4_ = iVar50;
          auVar27._0_4_ = iVar50;
          auVar27._8_4_ = iVar153;
          auVar27._12_4_ = iVar153;
          auVar137 = pshufhw(auVar126,auVar27,0x84);
          auVar112 = pshufhw(auVar135,auVar151,0x84);
          auVar115._8_4_ = 0xffffffff;
          auVar115._0_8_ = 0xffffffffffffffff;
          auVar115._12_4_ = 0xffffffff;
          auVar115 = (auVar112 | auVar137 & auVar135) ^ auVar115;
          auVar135 = packssdw(auVar115,auVar115);
          auVar135 = packsswb(auVar135,auVar135);
          if ((auVar135._6_2_ >> 8 & 1) != 0) {
            local_4036[uVar70 * 2 + lVar73 + 0xf] = 0;
          }
          auVar135 = (auVar133 | _DAT_00181180) ^ _DAT_0017ad70;
          auVar127._0_4_ = -(uint)(iVar48 < auVar135._0_4_);
          auVar127._4_4_ = -(uint)(iVar63 < auVar135._4_4_);
          auVar127._8_4_ = -(uint)(iVar71 < auVar135._8_4_);
          auVar127._12_4_ = -(uint)(iVar49 < auVar135._12_4_);
          auVar28._4_4_ = auVar127._0_4_;
          auVar28._0_4_ = auVar127._0_4_;
          auVar28._8_4_ = auVar127._8_4_;
          auVar28._12_4_ = auVar127._8_4_;
          auVar137 = pshuflw(auVar151,auVar28,0xe8);
          auVar116._0_4_ = -(uint)(auVar135._0_4_ == iVar48);
          auVar116._4_4_ = -(uint)(auVar135._4_4_ == iVar63);
          auVar116._8_4_ = -(uint)(auVar135._8_4_ == iVar71);
          auVar116._12_4_ = -(uint)(auVar135._12_4_ == iVar49);
          auVar144._4_4_ = auVar116._4_4_;
          auVar144._0_4_ = auVar116._4_4_;
          auVar144._8_4_ = auVar116._12_4_;
          auVar144._12_4_ = auVar116._12_4_;
          auVar135 = pshuflw(auVar116,auVar144,0xe8);
          auVar145._4_4_ = auVar127._4_4_;
          auVar145._0_4_ = auVar127._4_4_;
          auVar145._8_4_ = auVar127._12_4_;
          auVar145._12_4_ = auVar127._12_4_;
          auVar112 = pshuflw(auVar127,auVar145,0xe8);
          auVar128._8_4_ = 0xffffffff;
          auVar128._0_8_ = 0xffffffffffffffff;
          auVar128._12_4_ = 0xffffffff;
          auVar128 = (auVar112 | auVar135 & auVar137) ^ auVar128;
          auVar112 = packssdw(auVar128,auVar128);
          auVar135 = packsswb(auVar135 & auVar137,auVar112);
          if ((auVar135 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_4036[uVar70 * 2 + lVar73 + 0x11] = 0;
          }
          auVar29._4_4_ = auVar127._0_4_;
          auVar29._0_4_ = auVar127._0_4_;
          auVar29._8_4_ = auVar127._8_4_;
          auVar29._12_4_ = auVar127._8_4_;
          auVar145 = auVar144 & auVar29 | auVar145;
          auVar112 = packssdw(auVar145,auVar145);
          auVar17._8_4_ = 0xffffffff;
          auVar17._0_8_ = 0xffffffffffffffff;
          auVar17._12_4_ = 0xffffffff;
          auVar112 = packssdw(auVar112 ^ auVar17,auVar112 ^ auVar17);
          auVar135 = packsswb(auVar135,auVar112);
          if ((auVar135._8_2_ >> 8 & 1) != 0) {
            local_4036[uVar70 * 2 + lVar73 + 0x13] = 0;
          }
          auVar135 = (auVar133 | _DAT_00181170) ^ _DAT_0017ad70;
          auVar129._0_4_ = -(uint)(iVar48 < auVar135._0_4_);
          auVar129._4_4_ = -(uint)(iVar63 < auVar135._4_4_);
          auVar129._8_4_ = -(uint)(iVar71 < auVar135._8_4_);
          auVar129._12_4_ = -(uint)(iVar49 < auVar135._12_4_);
          auVar146._4_4_ = auVar129._0_4_;
          auVar146._0_4_ = auVar129._0_4_;
          auVar146._8_4_ = auVar129._8_4_;
          auVar146._12_4_ = auVar129._8_4_;
          iVar50 = -(uint)(auVar135._4_4_ == iVar63);
          iVar153 = -(uint)(auVar135._12_4_ == iVar49);
          auVar30._4_4_ = iVar50;
          auVar30._0_4_ = iVar50;
          auVar30._8_4_ = iVar153;
          auVar30._12_4_ = iVar153;
          auVar152._4_4_ = auVar129._4_4_;
          auVar152._0_4_ = auVar129._4_4_;
          auVar152._8_4_ = auVar129._12_4_;
          auVar152._12_4_ = auVar129._12_4_;
          auVar135 = auVar30 & auVar146 | auVar152;
          auVar135 = packssdw(auVar135,auVar135);
          auVar18._8_4_ = 0xffffffff;
          auVar18._0_8_ = 0xffffffffffffffff;
          auVar18._12_4_ = 0xffffffff;
          auVar135 = packssdw(auVar135 ^ auVar18,auVar135 ^ auVar18);
          auVar135 = packsswb(auVar135,auVar135);
          if ((auVar135 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_4036[uVar70 * 2 + lVar73 + 0x15] = 0;
          }
          auVar135 = pshufhw(auVar135,auVar146,0x84);
          auVar31._4_4_ = iVar50;
          auVar31._0_4_ = iVar50;
          auVar31._8_4_ = iVar153;
          auVar31._12_4_ = iVar153;
          auVar137 = pshufhw(auVar129,auVar31,0x84);
          auVar112 = pshufhw(auVar135,auVar152,0x84);
          auVar117._8_4_ = 0xffffffff;
          auVar117._0_8_ = 0xffffffffffffffff;
          auVar117._12_4_ = 0xffffffff;
          auVar117 = (auVar112 | auVar137 & auVar135) ^ auVar117;
          auVar135 = packssdw(auVar117,auVar117);
          auVar135 = packsswb(auVar135,auVar135);
          if ((auVar135._10_2_ >> 8 & 1) != 0) {
            local_4036[uVar70 * 2 + lVar73 + 0x17] = 0;
          }
          auVar135 = (auVar133 | _DAT_00181160) ^ _DAT_0017ad70;
          auVar130._0_4_ = -(uint)(iVar48 < auVar135._0_4_);
          auVar130._4_4_ = -(uint)(iVar63 < auVar135._4_4_);
          auVar130._8_4_ = -(uint)(iVar71 < auVar135._8_4_);
          auVar130._12_4_ = -(uint)(iVar49 < auVar135._12_4_);
          auVar32._4_4_ = auVar130._0_4_;
          auVar32._0_4_ = auVar130._0_4_;
          auVar32._8_4_ = auVar130._8_4_;
          auVar32._12_4_ = auVar130._8_4_;
          auVar137 = pshuflw(auVar152,auVar32,0xe8);
          auVar118._0_4_ = -(uint)(auVar135._0_4_ == iVar48);
          auVar118._4_4_ = -(uint)(auVar135._4_4_ == iVar63);
          auVar118._8_4_ = -(uint)(auVar135._8_4_ == iVar71);
          auVar118._12_4_ = -(uint)(auVar135._12_4_ == iVar49);
          auVar147._4_4_ = auVar118._4_4_;
          auVar147._0_4_ = auVar118._4_4_;
          auVar147._8_4_ = auVar118._12_4_;
          auVar147._12_4_ = auVar118._12_4_;
          auVar135 = pshuflw(auVar118,auVar147,0xe8);
          auVar148._4_4_ = auVar130._4_4_;
          auVar148._0_4_ = auVar130._4_4_;
          auVar148._8_4_ = auVar130._12_4_;
          auVar148._12_4_ = auVar130._12_4_;
          auVar112 = pshuflw(auVar130,auVar148,0xe8);
          auVar19._8_4_ = 0xffffffff;
          auVar19._0_8_ = 0xffffffffffffffff;
          auVar19._12_4_ = 0xffffffff;
          auVar135 = packssdw(auVar135 & auVar137,(auVar112 | auVar135 & auVar137) ^ auVar19);
          auVar135 = packsswb(auVar135,auVar135);
          if ((auVar135 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_4036[uVar70 * 2 + lVar73 + 0x19] = 0;
          }
          auVar33._4_4_ = auVar130._0_4_;
          auVar33._0_4_ = auVar130._0_4_;
          auVar33._8_4_ = auVar130._8_4_;
          auVar33._12_4_ = auVar130._8_4_;
          auVar148 = auVar147 & auVar33 | auVar148;
          auVar112 = packssdw(auVar148,auVar148);
          auVar20._8_4_ = 0xffffffff;
          auVar20._0_8_ = 0xffffffffffffffff;
          auVar20._12_4_ = 0xffffffff;
          auVar135 = packssdw(auVar135,auVar112 ^ auVar20);
          auVar135 = packsswb(auVar135,auVar135);
          if ((auVar135._12_2_ >> 8 & 1) != 0) {
            local_4036[uVar70 * 2 + lVar73 + 0x1b] = 0;
          }
          auVar135 = (auVar133 | _DAT_00181150) ^ _DAT_0017ad70;
          auVar119._0_4_ = -(uint)(iVar48 < auVar135._0_4_);
          auVar119._4_4_ = -(uint)(iVar63 < auVar135._4_4_);
          auVar119._8_4_ = -(uint)(iVar71 < auVar135._8_4_);
          auVar119._12_4_ = -(uint)(iVar49 < auVar135._12_4_);
          auVar149._4_4_ = auVar119._0_4_;
          auVar149._0_4_ = auVar119._0_4_;
          auVar149._8_4_ = auVar119._8_4_;
          auVar149._12_4_ = auVar119._8_4_;
          auVar134._4_4_ = -(uint)(auVar135._4_4_ == iVar63);
          auVar134._12_4_ = -(uint)(auVar135._12_4_ == iVar49);
          auVar134._0_4_ = auVar134._4_4_;
          auVar134._8_4_ = auVar134._12_4_;
          auVar136._4_4_ = auVar119._4_4_;
          auVar136._0_4_ = auVar119._4_4_;
          auVar136._8_4_ = auVar119._12_4_;
          auVar136._12_4_ = auVar119._12_4_;
          auVar112 = auVar134 & auVar149 | auVar136;
          auVar135 = packssdw(auVar119,auVar112);
          auVar21._8_4_ = 0xffffffff;
          auVar21._0_8_ = 0xffffffffffffffff;
          auVar21._12_4_ = 0xffffffff;
          auVar135 = packssdw(auVar135 ^ auVar21,auVar135 ^ auVar21);
          auVar135 = packsswb(auVar135,auVar135);
          if ((auVar135 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_4036[uVar70 * 2 + lVar73 + 0x1d] = 0;
          }
          auVar135 = pshufhw(auVar135,auVar149,0x84);
          in_XMM2 = pshufhw(auVar112,auVar134,0x84);
          in_XMM2 = in_XMM2 & auVar135;
          auVar135 = pshufhw(auVar135,auVar136,0x84);
          auVar120._8_4_ = 0xffffffff;
          auVar120._0_8_ = 0xffffffffffffffff;
          auVar120._12_4_ = 0xffffffff;
          auVar120 = (auVar135 | in_XMM2) ^ auVar120;
          auVar135 = packssdw(auVar120,auVar120);
          in_XMM1 = packsswb(auVar135,auVar135);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            local_4036[uVar70 * 2 + lVar73 + 0x1f] = 0;
          }
          uVar70 = uVar70 + 0x10;
        } while ((lVar55 + 0xfU & 0xfffffffffffffff0) != uVar70);
      }
      lVar73 = 0;
      memset(local_3420,0,0x1200);
      iVar48 = 0;
      do {
        bVar46 = local_4038;
        local_4358 = (ma_uint8 *)lVar73;
        uVar47 = local_4360->layer;
        uVar70 = (ulong)local_4038;
        uVar84 = (ulong)uVar47 | 1;
        uVar87 = (uint)local_4038;
        iVar63 = 0x240;
        lVar73 = 0;
        do {
          local_43d8._0_4_ = (uint)bVar46;
          if ((uint)local_43d8 != 0) {
            pfVar77 = local_3420 + (long)iVar48 + lVar73 * ((long)(int)uVar47 | 1U);
            uVar95 = 0;
            do {
              bVar61 = local_4036[uVar95];
              if (bVar61 != 0) {
                if (bVar61 < 0x11) {
                  if (-1 < (int)uVar47) {
                    uVar96 = 0;
                    do {
                      mVar53 = ma_dr_mp3_bs_get_bits(&local_4388,(uint)bVar61);
                      pfVar77[uVar96] = (float)(int)(mVar53 + (-1 << (bVar61 - 1 & 0x1f)) + 1);
                      uVar96 = uVar96 + 1;
                    } while (uVar84 != uVar96);
                  }
                }
                else {
                  uVar52 = 2 << (bVar61 - 0x11 & 0x1f);
                  mVar53 = ma_dr_mp3_bs_get_bits(&local_4388,(uVar52 - (uVar52 >> 3)) + 3);
                  if (-1 < (int)uVar47) {
                    uVar96 = 0;
                    do {
                      pfVar77[uVar96] = (float)(int)(mVar53 % (uVar52 + 1) - (uVar52 >> 1));
                      uVar96 = uVar96 + 1;
                      mVar53 = mVar53 / (uVar52 + 1);
                    } while (uVar84 != uVar96);
                  }
                }
              }
              pfVar77 = pfVar77 + iVar63;
              iVar63 = 0x12 - iVar63;
              uVar95 = uVar95 + 1;
            } while (uVar95 != uVar87 * 2);
          }
          lVar73 = lVar73 + 1;
        } while (lVar73 != 4);
        iVar48 = iVar48 + (int)uVar84 * 4;
        if (iVar48 == 0xc) {
          memcpy(local_2b20 + (uint)local_4037 * 0x48,
                 (void *)((ulong)((uint)local_4037 * 0x48) + (long)local_3420),
                 (uVar70 - local_4037) * 0x48);
          pmVar92 = local_4358;
          pmVar97 = local_4360;
          pmVar88 = local_4370;
          if ((uint)local_43d8 != 0) {
            pfVar59 = (float *)(&local_4338 + (long)local_4358);
            uVar47 = 0;
            pfVar77 = local_3420;
            do {
              fVar100 = *pfVar59;
              fVar103 = pfVar59[3];
              lVar73 = 0;
              do {
                pfVar80 = pfVar77 + lVar73;
                fVar104 = pfVar80[1];
                fVar35 = pfVar80[2];
                fVar36 = pfVar80[3];
                pfVar82 = pfVar77 + lVar73;
                *pfVar82 = *pfVar80 * fVar100;
                pfVar82[1] = fVar104 * fVar100;
                pfVar82[2] = fVar35 * fVar100;
                pfVar82[3] = fVar36 * fVar100;
                pfVar80 = pfVar77 + lVar73 + 0x240;
                auVar131._0_4_ = *pfVar80 * fVar103;
                auVar131._4_4_ = pfVar80[1] * fVar103;
                auVar131._8_4_ = pfVar80[2] * fVar103;
                auVar131._12_4_ = pfVar80[3] * fVar103;
                *(undefined1 (*) [16])(pfVar77 + lVar73 + 0x240) = auVar131;
                lVar73 = lVar73 + 4;
              } while (lVar73 != 0xc);
              uVar47 = uVar47 + 1;
              pfVar77 = pfVar77 + 0x12;
              pfVar59 = pfVar59 + 6;
            } while (uVar47 != (uint)local_43d8);
          }
          ma_dr_mp3d_synth_granule
                    (dec->qmf_state,local_3420,0xc,local_4360->channels,local_4370,local_2180);
          iVar48 = 0;
          memset(local_3420,0,0x1200);
          local_4370 = pmVar88 + (long)pmVar97->channels * 0x180;
          local_4358 = pmVar92;
        }
        if (local_4388.limit < local_4388.pos) {
          dec->header[0] = '\0';
          bVar99 = false;
          local_4388.pos = 0;
          goto LAB_0015b345;
        }
        lVar73 = (long)local_4358 + 1;
      } while (lVar73 != 3);
      bVar99 = true;
    }
LAB_0015b345:
    uVar47 = 1;
  }
  if (bVar99) {
    local_4388.pos = 0x180;
    if ((~dec->header[1] & 6) != 0) {
      local_4388.pos = 0x480 >> ((dec->header[1] & 0xe) == 2);
    }
    local_4388.pos = local_4388.pos * uVar47;
  }
  return local_4388.pos;
}

Assistant:

MA_API int ma_dr_mp3dec_decode_frame(ma_dr_mp3dec *dec, const ma_uint8 *mp3, int mp3_bytes, void *pcm, ma_dr_mp3dec_frame_info *info)
{
    int i = 0, igr, frame_size = 0, success = 1;
    const ma_uint8 *hdr;
    ma_dr_mp3_bs bs_frame[1];
    ma_dr_mp3dec_scratch scratch;
    if (mp3_bytes > 4 && dec->header[0] == 0xff && ma_dr_mp3_hdr_compare(dec->header, mp3))
    {
        frame_size = ma_dr_mp3_hdr_frame_bytes(mp3, dec->free_format_bytes) + ma_dr_mp3_hdr_padding(mp3);
        if (frame_size != mp3_bytes && (frame_size + MA_DR_MP3_HDR_SIZE > mp3_bytes || !ma_dr_mp3_hdr_compare(mp3, mp3 + frame_size)))
        {
            frame_size = 0;
        }
    }
    if (!frame_size)
    {
        MA_DR_MP3_ZERO_MEMORY(dec, sizeof(ma_dr_mp3dec));
        i = ma_dr_mp3d_find_frame(mp3, mp3_bytes, &dec->free_format_bytes, &frame_size);
        if (!frame_size || i + frame_size > mp3_bytes)
        {
            info->frame_bytes = i;
            return 0;
        }
    }
    hdr = mp3 + i;
    MA_DR_MP3_COPY_MEMORY(dec->header, hdr, MA_DR_MP3_HDR_SIZE);
    info->frame_bytes = i + frame_size;
    info->channels = MA_DR_MP3_HDR_IS_MONO(hdr) ? 1 : 2;
    info->hz = ma_dr_mp3_hdr_sample_rate_hz(hdr);
    info->layer = 4 - MA_DR_MP3_HDR_GET_LAYER(hdr);
    info->bitrate_kbps = ma_dr_mp3_hdr_bitrate_kbps(hdr);
    ma_dr_mp3_bs_init(bs_frame, hdr + MA_DR_MP3_HDR_SIZE, frame_size - MA_DR_MP3_HDR_SIZE);
    if (MA_DR_MP3_HDR_IS_CRC(hdr))
    {
        ma_dr_mp3_bs_get_bits(bs_frame, 16);
    }
    if (info->layer == 3)
    {
        int main_data_begin = ma_dr_mp3_L3_read_side_info(bs_frame, scratch.gr_info, hdr);
        if (main_data_begin < 0 || bs_frame->pos > bs_frame->limit)
        {
            ma_dr_mp3dec_init(dec);
            return 0;
        }
        success = ma_dr_mp3_L3_restore_reservoir(dec, bs_frame, &scratch, main_data_begin);
        if (success && pcm != NULL)
        {
            for (igr = 0; igr < (MA_DR_MP3_HDR_TEST_MPEG1(hdr) ? 2 : 1); igr++, pcm = MA_DR_MP3_OFFSET_PTR(pcm, sizeof(ma_dr_mp3d_sample_t)*576*info->channels))
            {
                MA_DR_MP3_ZERO_MEMORY(scratch.grbuf[0], 576*2*sizeof(float));
                ma_dr_mp3_L3_decode(dec, &scratch, scratch.gr_info + igr*info->channels, info->channels);
                ma_dr_mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 18, info->channels, (ma_dr_mp3d_sample_t*)pcm, scratch.syn[0]);
            }
        }
        ma_dr_mp3_L3_save_reservoir(dec, &scratch);
    } else
    {
#ifdef MA_DR_MP3_ONLY_MP3
        return 0;
#else
        ma_dr_mp3_L12_scale_info sci[1];
        if (pcm == NULL) {
            return ma_dr_mp3_hdr_frame_samples(hdr);
        }
        ma_dr_mp3_L12_read_scale_info(hdr, bs_frame, sci);
        MA_DR_MP3_ZERO_MEMORY(scratch.grbuf[0], 576*2*sizeof(float));
        for (i = 0, igr = 0; igr < 3; igr++)
        {
            if (12 == (i += ma_dr_mp3_L12_dequantize_granule(scratch.grbuf[0] + i, bs_frame, sci, info->layer | 1)))
            {
                i = 0;
                ma_dr_mp3_L12_apply_scf_384(sci, sci->scf + igr, scratch.grbuf[0]);
                ma_dr_mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 12, info->channels, (ma_dr_mp3d_sample_t*)pcm, scratch.syn[0]);
                MA_DR_MP3_ZERO_MEMORY(scratch.grbuf[0], 576*2*sizeof(float));
                pcm = MA_DR_MP3_OFFSET_PTR(pcm, sizeof(ma_dr_mp3d_sample_t)*384*info->channels);
            }
            if (bs_frame->pos > bs_frame->limit)
            {
                ma_dr_mp3dec_init(dec);
                return 0;
            }
        }
#endif
    }
    return success*ma_dr_mp3_hdr_frame_samples(dec->header);
}